

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

CVmTimeZone * CVmObjDate::get_tz_arg(uint argn,uint argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  CVmTimeZone *pCVar3;
  CVmObject *pCVar4;
  uint in_ESI;
  uint in_EDI;
  vm_val_t *unaff_retaddr;
  CVmObjTimeZone *tzobj;
  vm_val_t *argp;
  CVmTimeZoneCache *in_stack_00000298;
  CVmObject *local_28;
  undefined8 in_stack_fffffffffffffff8;
  int argc_00;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  pvVar2 = CVmStack::get((ulong)in_EDI);
  if ((in_EDI == in_ESI) || (pvVar2->typ == VM_NIL)) {
    pCVar3 = CVmTimeZoneCache::get_local_zone(in_stack_00000298);
    return pCVar3;
  }
  if (in_ESI <= in_EDI) goto LAB_002f09ed;
  if (pvVar2->typ == VM_OBJ) {
    pCVar4 = vm_objp(0);
    iVar1 = (*pCVar4->_vptr_CVmObject[1])(pCVar4,CVmObjTimeZone::metaclass_reg_);
    if (iVar1 == 0) goto LAB_002f09c5;
    local_28 = vm_objp(0);
  }
  else {
LAB_002f09c5:
    local_28 = (CVmObject *)0x0;
  }
  if (local_28 != (CVmObject *)0x0) {
    pCVar3 = CVmObjTimeZone::get_tz((CVmObjTimeZone *)0x2f09e6);
    return pCVar3;
  }
LAB_002f09ed:
  pCVar3 = CVmObjTimeZone::parse_ctor_args(unaff_retaddr,argc_00);
  return pCVar3;
}

Assistant:

CVmTimeZone *CVmObjDate::get_tz_arg(VMG_ uint argn, uint argc)
{
    /* if the argument is nil or missing, use the default local zone */
    vm_val_t *argp = G_stk->get(argn);
    if (argn == argc || argp->typ == VM_NIL)
        return G_tzcache->get_local_zone(vmg0_);

    /* check for a TimeZone object */
    CVmObjTimeZone *tzobj;
    if (argn < argc && (tzobj = vm_val_cast(CVmObjTimeZone, argp)) != 0)
        return tzobj->get_tz();

    /* otherwise, accept anything that the TimeZone constructor accepts */
    return CVmObjTimeZone::parse_ctor_args(vmg_ argp, argc - argn);
}